

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_conn_config_update(Curl_easy *data,_Bool for_proxy)

{
  ssl_config_data *psVar1;
  ssl_primary_config *local_38;
  ssl_primary_config *dest;
  ssl_primary_config *src;
  _Bool for_proxy_local;
  Curl_easy *data_local;
  
  if (data->conn != (connectdata *)0x0) {
    if (for_proxy) {
      psVar1 = &(data->set).proxy_ssl;
      local_38 = &data->conn->proxy_ssl_config;
    }
    else {
      psVar1 = &(data->set).ssl;
      local_38 = &data->conn->ssl_config;
    }
    local_38->field_0x79 =
         local_38->field_0x79 & 0xfd | ((byte)(psVar1->primary).field_0x79 >> 1 & 1) << 1;
    local_38->field_0x79 = local_38->field_0x79 & 0xfe | (psVar1->primary).field_0x79 & 1;
    local_38->field_0x79 =
         local_38->field_0x79 & 0xfb | ((byte)(psVar1->primary).field_0x79 >> 2 & 1) << 2;
  }
  return;
}

Assistant:

void Curl_ssl_conn_config_update(struct Curl_easy *data, bool for_proxy)
{
  /* May be called on an easy that has no connection yet */
  if(data->conn) {
    struct ssl_primary_config *src, *dest;
#ifndef CURL_DISABLE_PROXY
    src = for_proxy? &data->set.proxy_ssl.primary : &data->set.ssl.primary;
    dest = for_proxy? &data->conn->proxy_ssl_config : &data->conn->ssl_config;
#else
    (void)for_proxy;
    src = &data->set.ssl.primary;
    dest = &data->conn->ssl_config;
#endif
    dest->verifyhost = src->verifyhost;
    dest->verifypeer = src->verifypeer;
    dest->verifystatus = src->verifystatus;
  }
}